

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O2

bool __thiscall
QSqlQueryModel::insertColumns(QSqlQueryModel *this,int column,int count,QModelIndex *parent)

{
  QSqlRecord *this_00;
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  undefined4 uVar7;
  ulong uVar8;
  int c;
  int iVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a8;
  int nVal;
  undefined4 uStack_84;
  char16_t *pcStack_80;
  qsizetype local_78;
  QSqlField field;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < count) {
    lVar3 = *(long *)&this->field_0x8;
    bVar5 = QModelIndex::isValid(parent);
    if (-1 < column && !bVar5) {
      this_00 = (QSqlRecord *)(lVar3 + 0x100);
      iVar6 = QSqlRecord::count(this_00);
      iVar9 = 0;
      if (column <= iVar6) {
        beginInsertColumns(this,parent,column,count + column + -1);
        for (; iVar9 != count; iVar9 = iVar9 + 1) {
          field.d.d.ptr = (totally_ordered_wrapper<QSqlFieldPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
          field.val.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          field.val.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          field.val.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          field.val.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          _nVal = (Data *)0x0;
          pcStack_80 = (char16_t *)0x0;
          local_78 = 0;
          local_a8.d = (Data *)0x0;
          local_a8.ptr = (char16_t *)0x0;
          local_a8.size = 0;
          QSqlField::QSqlField(&field,(QString *)&nVal,(QMetaType)0x0,(QString *)&local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&nVal);
          QSqlField::setReadOnly(&field,true);
          QSqlField::setGenerated(&field,false);
          QSqlRecord::insert(this_00,column,&field);
          lVar4 = *(long *)(lVar3 + 0x130);
          iVar6 = QSqlRecord::count(this_00);
          if (lVar4 < iVar6) {
            if (*(long *)(lVar3 + 0x130) == 0) {
              uVar7 = 0;
            }
            else {
              uVar7 = *(undefined4 *)(*(long *)(lVar3 + 0x138) + -4 + *(long *)(lVar3 + 0x130) * 4);
            }
            _nVal = (Data *)CONCAT44(uStack_84,uVar7);
            QVarLengthArray<int,_56LL>::append((QVarLengthArray<int,_56LL> *)(lVar3 + 0x128),&nVal);
          }
          lVar4 = *(long *)(lVar3 + 0x130);
          for (uVar8 = (ulong)(column + 1); (long)uVar8 < lVar4; uVar8 = uVar8 + 1) {
            piVar1 = (int *)(*(long *)(lVar3 + 0x138) + uVar8 * 4);
            *piVar1 = *piVar1 + 1;
          }
          QSqlField::~QSqlField(&field);
        }
        endInsertColumns(this);
        iVar9 = 1;
      }
      goto LAB_0012b24f;
    }
  }
  iVar9 = 0;
LAB_0012b24f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return SUB41(iVar9,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQueryModel::insertColumns(int column, int count, const QModelIndex &parent)
{
    Q_D(QSqlQueryModel);
    if (count <= 0 || parent.isValid() || column < 0 || column > d->rec.count())
        return false;

    beginInsertColumns(parent, column, column + count - 1);
    for (int c = 0; c < count; ++c) {
        QSqlField field;
        field.setReadOnly(true);
        field.setGenerated(false);
        d->rec.insert(column, field);
        if (d->colOffsets.size() < d->rec.count()) {
            int nVal = d->colOffsets.isEmpty() ? 0 : d->colOffsets[d->colOffsets.size() - 1];
            d->colOffsets.append(nVal);
            Q_ASSERT(d->colOffsets.size() >= d->rec.count());
        }
        for (qsizetype i = column + 1; i < d->colOffsets.size(); ++i)
            ++d->colOffsets[i];
    }
    endInsertColumns();
    return true;
}